

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeysTool.cpp
# Opt level: O0

int runCommand(string *command,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args,path *keyFile)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  *this;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  __l;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  pointer ppVar4;
  runtime_error *prVar5;
  const_reference data;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  _Self local_110;
  _Self local_108;
  const_iterator iArgs;
  int local_f8 [7];
  int local_dc;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_58;
  iterator local_30;
  size_type local_28;
  path *local_20;
  path *keyFile_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  string *command_local;
  
  local_20 = keyFile;
  keyFile_local = (path *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)command;
  if ((runCommand(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,boost::filesystem::path_const&)
       ::commandArgs_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&runCommand(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,boost::filesystem::path_const&)
                                   ::commandArgs_abi_cxx11_), iVar2 != 0)) {
    local_d8 = &local_d0;
    local_dc = 0;
    beast::unit_test::std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[12],_int,_true>(local_d8,(char (*) [12])"create_keys",&local_dc);
    local_d8 = &local_a8;
    local_f8[2] = 0;
    beast::unit_test::std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[13],_int,_true>(local_d8,(char (*) [13])"create_token",local_f8 + 2);
    local_d8 = &local_80;
    local_f8[1] = 0;
    beast::unit_test::std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[12],_int,_true>(local_d8,(char (*) [12])"revoke_keys",local_f8 + 1);
    local_d8 = &local_58;
    local_f8[0] = 1;
    beast::unit_test::std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::pair<const_char_(&)[5],_int,_true>(local_d8,(char (*) [5])0x464c73,local_f8);
    local_30 = &local_d0;
    local_28 = 4;
    this = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
            *)((long)&iArgs._M_node + 6);
    beast::unit_test::std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
    ::allocator(this);
    __l._M_len = local_28;
    __l._M_array = local_30;
    beast::unit_test::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::map(&runCommand(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,boost::filesystem::path_const&)
           ::commandArgs_abi_cxx11_,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          ((long)&iArgs._M_node + 7),this);
    beast::unit_test::std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
    ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                  *)((long)&iArgs._M_node + 6));
    local_148 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                 *)&local_30;
    do {
      local_148 = local_148 + -1;
      beast::unit_test::std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::~pair(local_148);
    } while (local_148 != &local_d0);
    __cxa_atexit(beast::unit_test::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::~map,&runCommand(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,boost::filesystem::path_const&)
                         ::commandArgs_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&runCommand(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,boost::filesystem::path_const&)
                         ::commandArgs_abi_cxx11_);
  }
  local_108._M_node =
       (_Base_ptr)
       beast::unit_test::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find(&runCommand(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,boost::filesystem::path_const&)
               ::commandArgs_abi_cxx11_,(key_type *)args_local);
  local_110._M_node =
       (_Base_ptr)
       beast::unit_test::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end(&runCommand(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,boost::filesystem::path_const&)
              ::commandArgs_abi_cxx11_);
  bVar1 = beast::unit_test::std::operator==(&local_108,&local_110);
  if (bVar1) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_130,"Unknown command: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_local);
    std::runtime_error::runtime_error(prVar5,(string *)&local_130);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar3 = beast::unit_test::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)keyFile_local);
  ppVar4 = beast::unit_test::std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
           ::operator->(&local_108);
  if (sVar3 == ppVar4->second) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            args_local,"create_keys");
    if (bVar1) {
      createKeyFile(local_20);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              args_local,"create_token");
      if (bVar1) {
        createToken(local_20);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )args_local,"revoke_keys");
        if (bVar1) {
          createRevocation(local_20);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)args_local,"sign");
          if (bVar1) {
            data = beast::unit_test::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)keyFile_local,0);
            signData(data,local_20);
          }
        }
      }
    }
    return 0;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,"Syntax error: Wrong number of arguments");
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int runCommand (std::string const& command,
    std::vector <std::string> const& args,
    boost::filesystem::path const& keyFile)
{
    using namespace std;

    static map<string, vector<string>::size_type> const commandArgs = {
        { "create_keys", 0 },
        { "create_token", 0 },
        { "revoke_keys", 0 },
        { "sign", 1 }};

    auto const iArgs = commandArgs.find (command);

    if (iArgs == commandArgs.end ())
        throw std::runtime_error ("Unknown command: " + command);

    if (args.size() != iArgs->second)
        throw std::runtime_error ("Syntax error: Wrong number of arguments");

    if (command == "create_keys")
        createKeyFile (keyFile);
    else if (command == "create_token")
        createToken (keyFile);
    else if (command == "revoke_keys")
        createRevocation (keyFile);
    else if (command == "sign")
        signData (args[0], keyFile);

    return 0;
}